

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesBodySharedMass.cpp
# Opt level: O2

void __thiscall
chrono::ChVariablesBodySharedMass::Build_M
          (ChVariablesBodySharedMass *this,ChSparseMatrix *storage,int insrow,int inscol,double c_a)

{
  double c_a_local;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_b8;
  ChMatrix33<double> scaledJ;
  
  c_a_local = c_a;
  (**storage->_vptr_SparseMatrix)
            (c_a * this->sharedmass->mass,storage,(ulong)(uint)insrow,(ulong)(uint)inscol,1);
  (**storage->_vptr_SparseMatrix)
            (c_a * this->sharedmass->mass,storage,(ulong)(insrow + 1),(ulong)(inscol + 1),1);
  (**storage->_vptr_SparseMatrix)(storage,(ulong)(insrow + 2),(ulong)(inscol + 2),1);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
              *)&local_b8,(MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)this->sharedmass,&c_a_local
            );
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&scaledJ,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
              *)&local_b8);
  local_b8.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_cols = 0;
  local_b8.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  local_b8.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_rows = 0;
  local_b8.
  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
  .
  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
  .m_rows.m_value = 3;
  local_b8.
  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
  .
  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
  .m_cols.m_value = 3;
  local_b8.
  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
  .m_stride.m_outer.m_value = 3;
  local_b8.
  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
  .
  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
  .m_data = (PointerType)&scaledJ;
  PasteMatrix(storage,&local_b8,insrow + 3,inscol + 3,true);
  Eigen::internal::handmade_aligned_free
            (local_b8.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
             m_storage.m_data);
  return;
}

Assistant:

void ChVariablesBodySharedMass::Build_M(ChSparseMatrix& storage, int insrow, int inscol, const double c_a) {
    storage.SetElement(insrow + 0, inscol + 0, c_a * sharedmass->mass);
    storage.SetElement(insrow + 1, inscol + 1, c_a * sharedmass->mass);
    storage.SetElement(insrow + 2, inscol + 2, c_a * sharedmass->mass);
    ChMatrix33<> scaledJ = sharedmass->inertia * c_a;
    PasteMatrix(storage, scaledJ, insrow + 3, inscol + 3);
}